

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.cpp
# Opt level: O3

void duckdb::DecimalRoundPositivePrecisionFunction<duckdb::hugeint_t,duckdb::Hugeint>
               (DataChunk *input,ExpressionState *state,Vector *result)

{
  hugeint_t *phVar1;
  unsigned_long *puVar2;
  ulong uVar3;
  sel_t *psVar4;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  uint64_t uVar5;
  int64_t iVar6;
  ulong uVar7;
  byte bVar8;
  bool bVar9;
  BoundFunctionExpression *pBVar10;
  pointer pFVar11;
  const_reference this_00;
  pointer pEVar12;
  long lVar13;
  reference vector;
  ulong uVar14;
  TemplatedValidityData<unsigned_long> *pTVar15;
  _Head_base<0UL,_unsigned_long_*,_false> _Var16;
  idx_t iVar17;
  undefined1 *puVar18;
  int64_t *piVar19;
  idx_t idx_in_entry;
  ulong uVar20;
  idx_t iVar21;
  data_ptr_t pdVar22;
  hugeint_t hVar23;
  hugeint_t addition;
  idx_t local_100;
  hugeint_t local_f8;
  data_ptr_t local_e0;
  hugeint_t local_d8;
  ulong local_c8;
  buffer_ptr<ValidityBuffer> *local_c0;
  hugeint_t local_b8;
  reference local_a0;
  ulong local_98;
  data_ptr_t local_90;
  UnifiedVectorFormat local_88;
  hugeint_t local_40;
  
  pBVar10 = BaseExpression::Cast<duckdb::BoundFunctionExpression>
                      (&state->expr->super_BaseExpression);
  pFVar11 = unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>,_true>::
            operator->(&pBVar10->bind_info);
  this_00 = vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
            ::operator[](&pBVar10->children,0);
  pEVar12 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
            operator->(this_00);
  bVar8 = DecimalType::GetScale(&pEVar12->return_type);
  lVar13 = ((ulong)bVar8 - (long)*(int *)&pFVar11[1]._vptr_FunctionData) * 0x10;
  local_b8.lower = *(uint64_t *)(Hugeint::POWERS_OF_TEN + lVar13);
  local_b8.upper = *(int64_t *)(Hugeint::POWERS_OF_TEN + lVar13 + 8);
  hugeint_t::hugeint_t((hugeint_t *)&local_88,2);
  local_d8 = hugeint_t::operator/(&local_b8,(hugeint_t *)&local_88);
  vector = vector<duckdb::Vector,_true>::operator[](&input->data,0);
  local_100 = input->count;
  if (vector->vector_type == FLAT_VECTOR) {
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar22 = result->data;
    local_e0 = vector->data;
    FlatVector::VerifyFlatVector(vector);
    FlatVector::VerifyFlatVector(result);
    puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if (puVar2 == (unsigned_long *)0x0) {
      if (local_100 != 0) {
        lVar13 = 0;
        do {
          local_88.sel = *(SelectionVector **)(local_e0 + lVar13);
          local_88.data = *(data_ptr_t *)(local_e0 + lVar13 + 8);
          hugeint_t::hugeint_t(&local_f8,0);
          bVar9 = hugeint_t::operator<((hugeint_t *)&local_88,&local_f8);
          if (bVar9) {
            hugeint_t::operator-=((hugeint_t *)&local_88,&local_d8);
          }
          else {
            hugeint_t::operator+=((hugeint_t *)&local_88,&local_d8);
          }
          hVar23 = hugeint_t::operator/((hugeint_t *)&local_88,&local_b8);
          *(uint64_t *)(pdVar22 + lVar13) = hVar23.lower;
          *(int64_t *)(pdVar22 + lVar13 + 8) = hVar23.upper;
          lVar13 = lVar13 + 0x10;
          local_100 = local_100 - 1;
        } while (local_100 != 0);
      }
    }
    else {
      (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask = puVar2;
      shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator=
                (&(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data,
                 &(vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_data);
      (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity =
           (vector->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
      if (0x3f < local_100 + 0x3f) {
        local_98 = local_100 + 0x3f >> 6;
        uVar20 = 0;
        local_c8 = 0;
        local_a0 = vector;
        local_90 = pdVar22;
        do {
          puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar2 == (unsigned_long *)0x0) {
            uVar14 = uVar20 + 0x40;
            if (local_100 <= uVar20 + 0x40) {
              uVar14 = local_100;
            }
LAB_00fc436c:
            uVar7 = uVar20;
            if (uVar20 < uVar14) {
              lVar13 = uVar20 << 4;
              do {
                local_88.sel = *(SelectionVector **)(local_e0 + lVar13);
                local_88.data = *(data_ptr_t *)(local_e0 + lVar13 + 8);
                hugeint_t::hugeint_t(&local_f8,0);
                bVar9 = hugeint_t::operator<((hugeint_t *)&local_88,&local_f8);
                if (bVar9) {
                  hugeint_t::operator-=((hugeint_t *)&local_88,&local_d8);
                }
                else {
                  hugeint_t::operator+=((hugeint_t *)&local_88,&local_d8);
                }
                hVar23 = hugeint_t::operator/((hugeint_t *)&local_88,&local_b8);
                *(uint64_t *)(pdVar22 + lVar13) = hVar23.lower;
                *(int64_t *)(pdVar22 + lVar13 + 8) = hVar23.upper;
                uVar20 = uVar20 + 1;
                lVar13 = lVar13 + 0x10;
                vector = local_a0;
                uVar7 = uVar14;
              } while (uVar14 != uVar20);
            }
          }
          else {
            uVar3 = puVar2[local_c8];
            uVar14 = uVar20 + 0x40;
            if (local_100 <= uVar20 + 0x40) {
              uVar14 = local_100;
            }
            uVar7 = uVar14;
            if (uVar3 != 0) {
              if (uVar3 == 0xffffffffffffffff) goto LAB_00fc436c;
              local_c0 = (buffer_ptr<ValidityBuffer> *)(uVar14 - uVar20);
              uVar7 = uVar20;
              if (uVar20 <= uVar14 && local_c0 != (buffer_ptr<ValidityBuffer> *)0x0) {
                lVar13 = uVar20 << 4;
                puVar18 = (undefined1 *)0x0;
                do {
                  if ((uVar3 >> ((ulong)puVar18 & 0x3f) & 1) != 0) {
                    local_88.sel = *(SelectionVector **)(local_e0 + lVar13);
                    local_88.data = *(data_ptr_t *)(local_e0 + lVar13 + 8);
                    hugeint_t::hugeint_t(&local_f8,0);
                    bVar9 = hugeint_t::operator<((hugeint_t *)&local_88,&local_f8);
                    if (bVar9) {
                      hugeint_t::operator-=((hugeint_t *)&local_88,&local_d8);
                    }
                    else {
                      hugeint_t::operator+=((hugeint_t *)&local_88,&local_d8);
                    }
                    pdVar22 = local_90;
                    hVar23 = hugeint_t::operator/((hugeint_t *)&local_88,&local_b8);
                    *(uint64_t *)(pdVar22 + lVar13) = hVar23.lower;
                    *(int64_t *)(pdVar22 + lVar13 + 8) = hVar23.upper;
                  }
                  puVar18 = puVar18 + 1;
                  lVar13 = lVar13 + 0x10;
                  vector = local_a0;
                  uVar7 = uVar14;
                } while (local_c0 != (buffer_ptr<ValidityBuffer> *)puVar18);
              }
            }
          }
          uVar20 = uVar7;
          local_c8 = local_c8 + 1;
        } while (local_c8 != local_98);
      }
    }
  }
  else if (vector->vector_type == CONSTANT_VECTOR) {
    Vector::SetVectorType(result,CONSTANT_VECTOR);
    phVar1 = (hugeint_t *)result->data;
    pdVar22 = vector->data;
    puVar2 = (vector->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar2 == (unsigned_long *)0x0) || ((*puVar2 & 1) != 0)) {
      ConstantVector::SetNull(result,false);
      local_88.sel = *(SelectionVector **)pdVar22;
      local_88.data = *(data_ptr_t *)(pdVar22 + 8);
      hugeint_t::hugeint_t(&local_f8,0);
      bVar9 = hugeint_t::operator<((hugeint_t *)&local_88,&local_f8);
      if (bVar9) {
        hugeint_t::operator-=((hugeint_t *)&local_88,&local_d8);
      }
      else {
        hugeint_t::operator+=((hugeint_t *)&local_88,&local_d8);
      }
      hVar23 = hugeint_t::operator/((hugeint_t *)&local_88,&local_b8);
      *phVar1 = hVar23;
    }
    else {
      ConstantVector::SetNull(result,true);
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_88);
    Vector::ToUnifiedFormat(vector,local_100,&local_88);
    Vector::SetVectorType(result,FLAT_VECTOR);
    pdVar22 = result->data;
    local_e0 = local_88.data;
    FlatVector::VerifyFlatVector(result);
    if (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (local_100 != 0) {
        psVar4 = (local_88.sel)->sel_vector;
        piVar19 = (int64_t *)(pdVar22 + 8);
        iVar21 = 0;
        do {
          iVar17 = iVar21;
          if (psVar4 != (sel_t *)0x0) {
            iVar17 = (idx_t)psVar4[iVar21];
          }
          local_f8.lower = *(uint64_t *)(local_e0 + iVar17 * 0x10);
          local_f8.upper = *(int64_t *)(local_e0 + iVar17 * 0x10 + 8);
          hugeint_t::hugeint_t(&local_40,0);
          bVar9 = hugeint_t::operator<(&local_f8,&local_40);
          if (bVar9) {
            hugeint_t::operator-=(&local_f8,&local_d8);
          }
          else {
            hugeint_t::operator+=(&local_f8,&local_d8);
          }
          hVar23 = hugeint_t::operator/(&local_f8,&local_b8);
          piVar19[-1] = hVar23.lower;
          *piVar19 = hVar23.upper;
          iVar21 = iVar21 + 1;
          piVar19 = piVar19 + 2;
        } while (local_100 != iVar21);
      }
    }
    else if (local_100 != 0) {
      psVar4 = (local_88.sel)->sel_vector;
      local_c0 = &(result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data;
      piVar19 = (int64_t *)(pdVar22 + 8);
      uVar20 = 0;
      do {
        uVar14 = uVar20;
        if (psVar4 != (sel_t *)0x0) {
          uVar14 = (ulong)psVar4[uVar20];
        }
        if ((local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[uVar14 >> 6]
             >> (uVar14 & 0x3f) & 1) == 0) {
          _Var16._M_head_impl =
               (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (_Var16._M_head_impl == (unsigned_long *)0x0) {
            local_40.lower = (result->validity).super_TemplatedValidityMask<unsigned_long>.capacity;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)&local_f8,&local_40.lower);
            iVar6 = local_f8.upper;
            uVar5 = local_f8.lower;
            local_f8.lower = 0;
            local_f8.upper = 0;
            this = (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)uVar5;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
            super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)iVar6;
            if ((this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
               (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this),
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.upper !=
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_f8.upper);
            }
            pTVar15 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                (local_c0);
            _Var16._M_head_impl =
                 (pTVar15->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            (result->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask =
                 _Var16._M_head_impl;
          }
          bVar8 = (byte)uVar20 & 0x3f;
          _Var16._M_head_impl[uVar20 >> 6] =
               _Var16._M_head_impl[uVar20 >> 6] &
               (-2L << bVar8 | 0xfffffffffffffffeU >> 0x40 - bVar8);
        }
        else {
          local_f8.lower = *(uint64_t *)(local_e0 + uVar14 * 0x10);
          local_f8.upper = *(int64_t *)(local_e0 + uVar14 * 0x10 + 8);
          hugeint_t::hugeint_t(&local_40,0);
          bVar9 = hugeint_t::operator<(&local_f8,&local_40);
          if (bVar9) {
            hugeint_t::operator-=(&local_f8,&local_d8);
          }
          else {
            hugeint_t::operator+=(&local_f8,&local_d8);
          }
          hVar23 = hugeint_t::operator/(&local_f8,&local_b8);
          piVar19[-1] = hVar23.lower;
          *piVar19 = hVar23.upper;
        }
        uVar20 = uVar20 + 1;
        piVar19 = piVar19 + 2;
      } while (local_100 != uVar20);
    }
    if (local_88.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_88.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void DecimalRoundPositivePrecisionFunction(DataChunk &input, ExpressionState &state, Vector &result) {
	auto &func_expr = state.expr.Cast<BoundFunctionExpression>();
	auto &info = func_expr.bind_info->Cast<RoundPrecisionFunctionData>();
	auto source_scale = DecimalType::GetScale(func_expr.children[0]->return_type);
	T power_of_ten = UnsafeNumericCast<T>(POWERS_OF_TEN_CLASS::POWERS_OF_TEN[source_scale - info.target_scale]);
	T addition = power_of_ten / 2;
	UnaryExecutor::Execute<T, T>(input.data[0], result, input.size(), [&](T input) {
		if (input < 0) {
			input -= addition;
		} else {
			input += addition;
		}
		return UnsafeNumericCast<T>(input / power_of_ten);
	});
}